

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_nls.c
# Opt level: O0

int cvNlsLSetup(int jbad,int *jcur,void *cvode_mem)

{
  int iVar1;
  long in_RDX;
  undefined4 *in_RSI;
  int in_EDI;
  int retval;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDX == 0) {
    cvProcessError((CVodeMem)0x0,-0x15,0xfb,"cvNlsLSetup",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_nls.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    if (in_EDI != 0) {
      *(undefined4 *)(in_RDX + 0x780) = 1;
    }
    iVar1 = (**(code **)(in_RDX + 0x7c8))
                      (in_RDX,*(undefined4 *)(in_RDX + 0x780),*(undefined8 *)(in_RDX + 0x1c0),
                       *(undefined8 *)(in_RDX + 0x1d8),in_RDX + 0x820,
                       *(undefined8 *)(in_RDX + 0x1e0),*(undefined8 *)(in_RDX + 0x1e8),
                       *(undefined8 *)(in_RDX + 0x1f0));
    *(long *)(in_RDX + 0x6c8) = *(long *)(in_RDX + 0x6c8) + 1;
    *in_RSI = *(undefined4 *)(in_RDX + 0x820);
    *(undefined4 *)(in_RDX + 0x7f8) = 0;
    *(undefined8 *)(in_RDX + 0x538) = 0x3ff0000000000000;
    *(undefined8 *)(in_RDX + 0x530) = *(undefined8 *)(in_RDX + 0x528);
    *(undefined8 *)(in_RDX + 0x540) = 0x3ff0000000000000;
    *(undefined8 *)(in_RDX + 0x548) = 0x3ff0000000000000;
    *(undefined8 *)(in_RDX + 0x800) = *(undefined8 *)(in_RDX + 0x628);
    if (iVar1 < 0) {
      local_4 = -6;
    }
    else if (iVar1 < 1) {
      local_4 = 0;
    }
    else {
      local_4 = 0x386;
    }
  }
  return local_4;
}

Assistant:

static int cvNlsLSetup(sunbooleantype jbad, sunbooleantype* jcur, void* cvode_mem)
{
  CVodeMem cv_mem;
  int retval;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* if the nonlinear solver marked the Jacobian as bad update convfail */
  if (jbad) { cv_mem->convfail = CV_FAIL_BAD_J; }

  /* setup the linear solver */
  retval = cv_mem->cv_lsetup(cv_mem, cv_mem->convfail, cv_mem->cv_y,
                             cv_mem->cv_ftemp, &(cv_mem->cv_jcur),
                             cv_mem->cv_vtemp1, cv_mem->cv_vtemp2,
                             cv_mem->cv_vtemp3);
  cv_mem->cv_nsetups++;

  /* update Jacobian status */
  *jcur = cv_mem->cv_jcur;

  cv_mem->cv_forceSetup = SUNFALSE;
  cv_mem->cv_gamrat     = ONE;
  cv_mem->cv_gammap     = cv_mem->cv_gamma;
  cv_mem->cv_crate      = ONE;
  cv_mem->cv_crateS     = ONE;
  cv_mem->cv_nstlp      = cv_mem->cv_nst;

  if (retval < 0) { return (CV_LSETUP_FAIL); }
  if (retval > 0) { return (SUN_NLS_CONV_RECVR); }

  return (CV_SUCCESS);
}